

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O2

string * HN::parseHTML(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  size_type sVar5;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"<p>",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\n",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(str,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  bVar4 = false;
  for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
    cVar1 = pcVar2[sVar5];
    if (cVar1 == '<') {
      bVar4 = true;
    }
    else if (cVar1 == '>') {
      bVar4 = false;
    }
    else if (!bVar4) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"&#x2F;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"/",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"&#x27;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\'",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"&gt;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,">",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_2401c,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"-",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_24030,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\"",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_24044,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\"",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_2404e,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\'",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_24058,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\'",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_24062,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\'",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"&quot;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\"",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"&amp;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"&",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_24096,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"-",&local_6a);
  anon_unknown.dwarf_2609f::replaceAll(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string parseHTML(std::string str) {
        ::replaceAll(str, "<p>", "\n");

        std::string res;
        bool inTag = false;
        for (auto & ch : str) {
            if (ch == '<') {
                inTag = true;
            } else if (ch == '>') {
                inTag = false;
            } else {
                if (inTag == false) {
                    res += ch;
                }
            }
        }

        ::replaceAll(res, "&#x2F;", "/");
        ::replaceAll(res, "&#x27;", "'");
        ::replaceAll(res, "&gt;", ">");
        ::replaceAll(res, "–", "-");
        ::replaceAll(res, "“", "\"");
        ::replaceAll(res, "”", "\"");
        ::replaceAll(res, "‘", "'");
        ::replaceAll(res, "’", "'");
        ::replaceAll(res, "„", "'");
        ::replaceAll(res, "&quot;", "\"");
        ::replaceAll(res, "&amp;", "&");
        ::replaceAll(res, "—", "-");

        return res;
    }